

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_buffer_encoder.c
# Opt level: O2

uint64_t lzma2_bound(uint64_t uncompressed_size)

{
  ulong uVar1;
  uint64_t uVar2;
  
  if (0x7ffffffffffffbbc < uncompressed_size) {
    return 0;
  }
  uVar1 = uncompressed_size + 0xffff >> 0x10;
  uVar2 = 0;
  if (uncompressed_size <= uVar1 * -3 + 0x7ffffffffffffbbb) {
    uVar2 = uncompressed_size + 1 + uVar1 * 3;
  }
  return uVar2;
}

Assistant:

static uint64_t
lzma2_bound(uint64_t uncompressed_size)
{
	// Prevent integer overflow in overhead calculation.
	if (uncompressed_size > COMPRESSED_SIZE_MAX)
		return 0;

	// Calculate the exact overhead of the LZMA2 headers: Round
	// uncompressed_size up to the next multiple of LZMA2_CHUNK_MAX,
	// multiply by the size of per-chunk header, and add one byte for
	// the end marker.
	const uint64_t overhead = ((uncompressed_size + LZMA2_CHUNK_MAX - 1)
				/ LZMA2_CHUNK_MAX)
			* LZMA2_HEADER_UNCOMPRESSED + 1;

	// Catch the possible integer overflow.
	if (COMPRESSED_SIZE_MAX - overhead < uncompressed_size)
		return 0;

	return uncompressed_size + overhead;
}